

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall opengv::absolute_pose::modules::Epnp::compute_pcs(Epnp *this)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int j;
  double *pc;
  double *a;
  int i;
  Epnp *this_local;
  
  for (i = 0; i < this->number_of_correspondences; i = i + 1) {
    pdVar2 = this->alphas + (i << 2);
    pdVar1 = this->pcs;
    for (j = 0; j < 3; j = j + 1) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *pdVar2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = this->ccs[0][j];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = pdVar2[1] * this->ccs[1][j];
      auVar3 = vfmadd213sd_fma(auVar6,auVar3,auVar8);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar2[2];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = this->ccs[2][j];
      auVar3 = vfmadd213sd_fma(auVar9,auVar4,auVar3);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pdVar2[3];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = this->ccs[3][j];
      auVar3 = vfmadd213sd_fma(auVar5,auVar7,auVar3);
      pdVar1[(long)(i * 3) + (long)j] = auVar3._0_8_;
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_pcs(void)
{
  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * a = alphas + 4 * i;
    double * pc = pcs + 3 * i;

    for(int j = 0; j < 3; j++)
      pc[j] =
          a[0] * ccs[0][j] +
          a[1] * ccs[1][j] +
          a[2] * ccs[2][j] +
          a[3] * ccs[3][j];
  }
}